

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_rope(ggml_context *ctx,ggml_tensor *a,int n_past,int n_dims,int mode)

{
  int *piVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  if (n_past < 0) {
    pcVar5 = "n_past >= 0";
    uVar4 = 0xfe5;
  }
  else {
    if (a->grad == (ggml_tensor *)0x0) {
      pgVar2 = ggml_view_tensor(ctx,a);
      pgVar3 = ggml_new_tensor_1d(ctx,GGML_TYPE_I32,3);
      piVar1 = (int *)pgVar3->data;
      *piVar1 = n_past;
      piVar1[1] = n_dims;
      piVar1[2] = mode;
      pgVar2->op = GGML_OP_ROPE;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = pgVar3;
      return pgVar2;
    }
    pcVar5 = "false";
    uVar4 = 0xfe9;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar4,
          pcVar5);
  abort();
}

Assistant:

struct ggml_tensor * ggml_rope(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past,
        int                   n_dims,
        int                   mode) {
    GGML_ASSERT(n_past >= 0);
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: when implement backward, fix this:
    //struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    struct ggml_tensor * b = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, 3);
    ((int32_t *) b->data)[0] = n_past;
    ((int32_t *) b->data)[1] = n_dims;
    ((int32_t *) b->data)[2] = mode;

    result->op   = GGML_OP_ROPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}